

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avs2d_vdpu382.c
# Opt level: O2

MPP_RET hal_avs2d_vdpu382_deinit(void *hal)

{
  long lVar1;
  void *ptr;
  undefined8 uVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = *(long *)((long)hal + 0x5a8);
  if ((avs2d_hal_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","In.","hal_avs2d_vdpu382_deinit");
  }
  if (lVar1 == 0) {
    uVar2 = 0xfffffc16;
    if (((byte)avs2d_hal_debug & 4) != 0) {
      _mpp_log_l(4,"hal_avs2d_vdpu382","input empty(%d).\n",(char *)0x0,0x225);
    }
  }
  else {
    lVar4 = 9;
    if (*(int *)((long)hal + 0x5a0) == 0) {
      lVar4 = 3;
    }
    puVar3 = (undefined8 *)(lVar1 + 0x1f0);
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 3) {
      if ((MppBuffer)*puVar3 != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller((MppBuffer)*puVar3,"hal_avs2d_vdpu382_deinit");
        *puVar3 = 0;
      }
      ptr = *(void **)(lVar1 + 0x10 + lVar5 * 8);
      if (ptr != (void *)0x0) {
        mpp_osal_free("hal_avs2d_vdpu382_deinit",ptr);
      }
      *(undefined8 *)(lVar1 + 0x10 + lVar5 * 8) = 0;
      puVar3 = puVar3 + 1;
    }
    if (*(MppBuffer *)(lVar1 + 0x1d8) != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x1d8),"hal_avs2d_vdpu382_deinit");
      *(undefined8 *)(lVar1 + 0x1d8) = 0;
    }
    if (*(HalBufs *)((long)hal + 0x28) != (HalBufs)0x0) {
      hal_bufs_deinit(*(HalBufs *)((long)hal + 0x28));
      *(undefined8 *)((long)hal + 0x28) = 0;
    }
    if (*(void **)((long)hal + 0x5a8) != (void *)0x0) {
      mpp_osal_free("hal_avs2d_vdpu382_deinit",*(void **)((long)hal + 0x5a8));
    }
    *(undefined8 *)((long)hal + 0x5a8) = 0;
    uVar2 = 0;
  }
  if ((avs2d_hal_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"hal_avs2d_vdpu382","Out. ret %d","hal_avs2d_vdpu382_deinit",uVar2);
  }
  return (MPP_RET)uVar2;
}

Assistant:

MPP_RET hal_avs2d_vdpu382_deinit(void *hal)
{
    MPP_RET ret = MPP_OK;
    RK_U32 i, loop;
    Avs2dHalCtx_t *p_hal = (Avs2dHalCtx_t *)hal;
    Avs2dVdpu382RegCtx_t *reg_ctx = (Avs2dVdpu382RegCtx_t *)p_hal->reg_ctx;

    AVS2D_HAL_TRACE("In.");

    INP_CHECK(ret, NULL == reg_ctx);

    //!< malloc buffers
    loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;
    for (i = 0; i < loop; i++) {
        if (reg_ctx->rcb_buf[i]) {
            mpp_buffer_put(reg_ctx->rcb_buf[i]);
            reg_ctx->rcb_buf[i] = NULL;
        }

        MPP_FREE(reg_ctx->reg_buf[i].regs);
    }

    if (reg_ctx->bufs) {
        mpp_buffer_put(reg_ctx->bufs);
        reg_ctx->bufs = NULL;
    }

    if (p_hal->cmv_bufs) {
        hal_bufs_deinit(p_hal->cmv_bufs);
        p_hal->cmv_bufs = NULL;
    }

    MPP_FREE(p_hal->reg_ctx);

__RETURN:
    AVS2D_HAL_TRACE("Out. ret %d", ret);
    return ret;
}